

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.hpp
# Opt level: O3

void __thiscall
diy::stats::DurationAccumulator::output(DurationAccumulator *this,ostream *out,string *prefix)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  ostream *poVar3;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args;
  long local_78 [2];
  long local_68;
  long local_58;
  long local_48;
  
  if (prefix->_M_string_length != 0) {
    std::__cxx11::string::append((char *)prefix);
  }
  for (p_Var1 = (this->duration)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    p_Var2 = p_Var1[5]._M_nxt;
    local_78[0] = (long)p_Var2 / 3600000000000;
    local_68 = (long)((int)((long)p_Var2 / 60000000000) % 0x3c);
    local_58 = ((long)p_Var2 / 1000000000) % 0x3c;
    local_48 = ((long)p_Var2 / 1000) % 1000000;
    format_str.size_ = 0x1b;
    format_str.data_ = "{:02d}:{:02d}:{:02d}.{:06d}";
    args.field_1.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         local_78;
    args.desc_ = 0x3333;
    fmt::v7::vprint<char>(poVar3,format_str,args);
    local_78[0]._0_1_ = 0x20;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_78,1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)p_Var1[1]._M_nxt,(long)p_Var1[2]._M_nxt);
    local_78[0] = CONCAT71(local_78[0]._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_78,1);
  }
  return;
}

Assistant:

void    output(std::ostream& out, std::string prefix = "") const
    {
        if (!prefix.empty())
            prefix += " ";

        for (auto& x : duration)
            out << prefix << x.second << ' ' << x.first << '\n';
    }